

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O1

bool __thiscall tcmalloc::PageHeap::EnsureLimit(PageHeap *this,Length n,bool withRelease)

{
  bool bVar1;
  Length LVar2;
  ulong uVar3;
  long lVar4;
  
  if (FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::FLAGS_tcmalloc_heap_limit_mb
      == 0) {
    bVar1 = true;
  }
  else {
    uVar3 = FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
            FLAGS_tcmalloc_heap_limit_mb * 0x80;
    lVar4 = (TCMalloc_SystemTaken >> 0xd) - ((this->stats_).unmapped_bytes >> 0xd);
    LVar2 = n + lVar4 +
            FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
            FLAGS_tcmalloc_heap_limit_mb * -0x80;
    if (withRelease && (uVar3 <= n + lVar4 && LVar2 != 0)) {
      LVar2 = ReleaseAtLeastNPages(this,LVar2);
      lVar4 = lVar4 - LVar2;
    }
    bVar1 = lVar4 + n <= uVar3;
  }
  return bVar1;
}

Assistant:

bool PageHeap::EnsureLimit(Length n, bool withRelease) {
  ASSERT(lock_.IsHeld());
  Length limit = (FLAGS_tcmalloc_heap_limit_mb*1024*1024) >> kPageShift;
  if (limit == 0) return true; //there is no limit

  // We do not use stats_.system_bytes because it does not take
  // MetaDataAllocs into account.
  Length takenPages = TCMalloc_SystemTaken >> kPageShift;
  //XXX takenPages may be slightly bigger than limit for two reasons:
  //* MetaDataAllocs ignore the limit (it is not easy to handle
  //  out of memory there)
  //* sys_alloc may round allocation up to huge page size,
  //  although smaller limit was ensured

  ASSERT(takenPages >= stats_.unmapped_bytes >> kPageShift);
  takenPages -= stats_.unmapped_bytes >> kPageShift;

  if (takenPages + n > limit && withRelease) {
    takenPages -= ReleaseAtLeastNPages(takenPages + n - limit);
  }

  return takenPages + n <= limit;
}